

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O2

adh_node_t * create_node(adh_symbol_t symbol)

{
  adh_order_t aVar1;
  adh_node_t *paVar2;
  
  aVar1 = adh_next_order;
  if (adh_next_order == 0) {
    paVar2 = (adh_node_t *)0x0;
    log_error("create_node","unexpected new node creation, adh_next_order = 0, symbol = %d \n",
              (ulong)(uint)(int)symbol);
  }
  else {
    paVar2 = (adh_node_t *)malloc(0x130);
    if (-1 < symbol) {
      symbol_node_array[(ushort)symbol] = paVar2;
    }
    paVar2->left = (adh_node *)0x0;
    paVar2->right = (adh_node *)0x0;
    paVar2->parent = (adh_node *)0x0;
    paVar2->order = aVar1;
    paVar2->weight = 0;
    paVar2->symbol = symbol;
    memset(&paVar2->bit_array,0,0x102);
    adh_next_order = aVar1 - 1;
  }
  return paVar2;
}

Assistant:

adh_node_t * create_node(adh_symbol_t symbol) {
    if(adh_next_order == 0) {
        log_error("create_node", "unexpected new node creation, adh_next_order = 0, symbol = %d \n", symbol);
        return NULL;
    }

#ifdef _DEBUG
    log_trace("     create_node", "%s (0,%d)\n", fmt_symbol(symbol), adh_next_order);
#endif

    adh_node_t* node = malloc (sizeof(adh_node_t));

    // if the new node is a symbol node
    // save its reference in the symbol_node_array to improve searches
    if(symbol > ADH_NYT_CODE)
        symbol_node_array[symbol] = node;

    node->left = NULL;
    node->right = NULL;
    node->parent = NULL;
    node->order = adh_next_order;
    node->weight = 0;
    node->symbol = symbol;
    memset(&(node->bit_array), 0, sizeof(bit_array_t));

    adh_next_order--;

    return node;
}